

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O1

NDeviceChannel * __thiscall
MlmWrap::findTrodesChannel
          (NDeviceChannel *__return_storage_ptr__,MlmWrap *this,NDevice *device,string *ch)

{
  pointer pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  pointer pNVar6;
  bool bVar7;
  long lVar8;
  __normal_iterator<NDeviceChannel_*,_std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>_>
  __it;
  __normal_iterator<NDeviceChannel_*,_std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>_>
  _Var9;
  vector<NDeviceChannel,_std::allocator<NDeviceChannel>_> channelsvec;
  uint *local_c8;
  long local_c0;
  undefined8 local_b8;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  uint *local_a8;
  long local_a0;
  uint local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  uint *local_88;
  long local_80;
  long local_78;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  long *local_68;
  long local_60;
  long local_58 [2];
  vector<NDeviceChannel,_std::allocator<NDeviceChannel>_> local_48;
  
  NDevice::getChannels(&local_48,device);
  pNVar6 = local_48.super__Vector_base<NDeviceChannel,_std::allocator<NDeviceChannel>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_68 = local_58;
  pcVar1 = (ch->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + ch->_M_string_length);
  local_a8 = &local_98;
  std::__cxx11::string::_M_construct<char*>((string *)&local_a8,local_68,local_60 + (long)local_68);
  uVar5 = local_98;
  local_80 = local_a0;
  if (local_a8 == &local_98) {
    uStack_b0 = uStack_90;
    uStack_ac = uStack_8c;
    local_c8 = (uint *)&local_b8;
  }
  else {
    local_c8 = local_a8;
  }
  local_b8 = CONCAT44(uStack_94,local_98);
  local_c0 = local_a0;
  local_a0 = 0;
  local_98 = local_98 & 0xffffff00;
  local_88 = (uint *)&local_78;
  if (local_c8 == (uint *)&local_b8) {
    local_78 = CONCAT44(uStack_94,uVar5);
    uStack_70 = uStack_b0;
    uStack_6c = uStack_ac;
  }
  else {
    local_88 = local_c8;
    local_78 = local_b8;
  }
  local_c8 = (uint *)&local_b8;
  local_a8 = &local_98;
  std::__cxx11::string::_M_construct<char*>((string *)&local_c8,local_88,local_80 + (long)local_88);
  lVar8 = (long)pNVar6 -
          (long)local_48.super__Vector_base<NDeviceChannel,_std::allocator<NDeviceChannel>_>._M_impl
                .super__Vector_impl_data._M_start >> 8;
  __it._M_current =
       local_48.super__Vector_base<NDeviceChannel,_std::allocator<NDeviceChannel>_>._M_impl.
       super__Vector_impl_data._M_start;
  if (0 < lVar8) {
    lVar8 = lVar8 + 1;
    do {
      bVar7 = __gnu_cxx::__ops::
              _Iter_pred<MlmWrap::findTrodesChannel(NDevice_const&,std::__cxx11::string)::$_0>::
              operator()((_Iter_pred<MlmWrap::findTrodesChannel(NDevice_const&,std::__cxx11::string)::__0>
                          *)&local_c8,__it);
      _Var9._M_current = __it._M_current;
      if (bVar7) goto LAB_00184962;
      bVar7 = __gnu_cxx::__ops::
              _Iter_pred<MlmWrap::findTrodesChannel(NDevice_const&,std::__cxx11::string)::$_0>::
              operator()((_Iter_pred<MlmWrap::findTrodesChannel(NDevice_const&,std::__cxx11::string)::__0>
                          *)&local_c8,__it._M_current + 1);
      _Var9._M_current = __it._M_current + 1;
      if (bVar7) goto LAB_00184962;
      bVar7 = __gnu_cxx::__ops::
              _Iter_pred<MlmWrap::findTrodesChannel(NDevice_const&,std::__cxx11::string)::$_0>::
              operator()((_Iter_pred<MlmWrap::findTrodesChannel(NDevice_const&,std::__cxx11::string)::__0>
                          *)&local_c8,__it._M_current + 2);
      _Var9._M_current = __it._M_current + 2;
      if (bVar7) goto LAB_00184962;
      bVar7 = __gnu_cxx::__ops::
              _Iter_pred<MlmWrap::findTrodesChannel(NDevice_const&,std::__cxx11::string)::$_0>::
              operator()((_Iter_pred<MlmWrap::findTrodesChannel(NDevice_const&,std::__cxx11::string)::__0>
                          *)&local_c8,__it._M_current + 3);
      _Var9._M_current = __it._M_current + 3;
      if (bVar7) goto LAB_00184962;
      __it._M_current = __it._M_current + 4;
      lVar8 = lVar8 + -1;
    } while (1 < lVar8);
  }
  lVar8 = (long)pNVar6 - (long)__it._M_current >> 6;
  if (lVar8 != 1) {
    if (lVar8 != 2) {
      _Var9._M_current = pNVar6;
      if ((lVar8 != 3) ||
         (bVar7 = __gnu_cxx::__ops::
                  _Iter_pred<MlmWrap::findTrodesChannel(NDevice_const&,std::__cxx11::string)::$_0>::
                  operator()((_Iter_pred<MlmWrap::findTrodesChannel(NDevice_const&,std::__cxx11::string)::__0>
                              *)&local_c8,__it), _Var9._M_current = __it._M_current, bVar7))
      goto LAB_00184962;
      __it._M_current = __it._M_current + 1;
    }
    bVar7 = __gnu_cxx::__ops::
            _Iter_pred<MlmWrap::findTrodesChannel(NDevice_const&,std::__cxx11::string)::$_0>::
            operator()((_Iter_pred<MlmWrap::findTrodesChannel(NDevice_const&,std::__cxx11::string)::__0>
                        *)&local_c8,__it);
    _Var9._M_current = __it._M_current;
    if (bVar7) goto LAB_00184962;
    __it._M_current = __it._M_current + 1;
  }
  bVar7 = __gnu_cxx::__ops::
          _Iter_pred<MlmWrap::findTrodesChannel(NDevice_const&,std::__cxx11::string)::$_0>::
          operator()((_Iter_pred<MlmWrap::findTrodesChannel(NDevice_const&,std::__cxx11::string)::__0>
                      *)&local_c8,__it);
  _Var9._M_current = pNVar6;
  if (bVar7) {
    _Var9._M_current = __it._M_current;
  }
LAB_00184962:
  if (local_c8 != (uint *)&local_b8) {
    operator_delete(local_c8,local_b8 + 1);
  }
  if (local_88 != (uint *)&local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  if (local_a8 != &local_98) {
    operator_delete(local_a8,CONCAT44(uStack_94,local_98) + 1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  if (_Var9._M_current ==
      local_48.super__Vector_base<NDeviceChannel,_std::allocator<NDeviceChannel>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    NDeviceChannel::NDeviceChannel(__return_storage_ptr__);
  }
  else {
    (__return_storage_ptr__->super_NetworkDataType)._vptr_NetworkDataType =
         (_func_int **)&PTR__NDeviceChannel_002e7550;
    (__return_storage_ptr__->id)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->id).field_2;
    pcVar1 = ((_Var9._M_current)->id)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->id,pcVar1,
               pcVar1 + ((_Var9._M_current)->id)._M_string_length);
    __return_storage_ptr__->interleavedDataBit = (_Var9._M_current)->interleavedDataBit;
    iVar2 = (_Var9._M_current)->startBit;
    iVar3 = (_Var9._M_current)->type;
    iVar4 = (_Var9._M_current)->interleavedDataByte;
    __return_storage_ptr__->startByte = (_Var9._M_current)->startByte;
    __return_storage_ptr__->startBit = iVar2;
    __return_storage_ptr__->type = iVar3;
    __return_storage_ptr__->interleavedDataByte = iVar4;
  }
  std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>::~vector(&local_48);
  return __return_storage_ptr__;
}

Assistant:

NDeviceChannel MlmWrap::findTrodesChannel(const NDevice& device, std::string ch){
    //Finding channel
//    NDevice* device = *deviceit;
    auto channelsvec = device.getChannels();
    auto channelit = std::find_if(channelsvec.begin(), channelsvec.end(),
                                  [ch](NDeviceChannel cha){return cha.getId() == ch;});
    if(channelit == channelsvec.end()){
        return NDeviceChannel();
    }
    return *channelit;
}